

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_rowcol
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  int iVar8;
  parasail_result_t *ppVar9;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong size;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int NWL;
  int NWS;
  int NWM;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  ulong local_f8;
  int local_e0;
  int local_dc;
  int local_d8;
  
  local_f8 = (ulong)(uint)s2Len;
  if (_s2 == (char *)0x0) {
    parasail_sw_stats_rowcol_cold_8();
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    parasail_sw_stats_rowcol_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sw_stats_rowcol_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sw_stats_rowcol_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_stats_rowcol_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_sw_stats_rowcol_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_sw_stats_rowcol_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sw_stats_rowcol_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type == 0) goto LAB_0055d34e;
  }
  _s1Len = matrix->length;
LAB_0055d34e:
  ppVar9 = parasail_result_new_rowcol3(_s1Len,s2Len);
  if (ppVar9 != (parasail_result_t *)0x0) {
    ppVar9->flag = ppVar9->flag | 0x1450104;
    ptr = parasail_memalign_int(0x10,(long)_s1Len);
    ptr_00 = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
    size = (ulong)(s2Len + 1);
    ptr_01 = parasail_memalign_int(0x10,size);
    ptr_02 = parasail_memalign_int(0x10,size);
    ptr_03 = parasail_memalign_int(0x10,size);
    ptr_04 = parasail_memalign_int(0x10,size);
    ptr_05 = parasail_memalign_int(0x10,size);
    ptr_06 = parasail_memalign_int(0x10,size);
    ptr_07 = parasail_memalign_int(0x10,size);
    ptr_08 = parasail_memalign_int(0x10,size);
    auVar30._0_4_ = -(uint)((int)ptr == 0);
    auVar30._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
    auVar30._8_4_ = -(uint)((int)ptr_00 == 0);
    auVar30._12_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
    auVar32._4_4_ = auVar30._0_4_;
    auVar32._0_4_ = auVar30._4_4_;
    auVar32._8_4_ = auVar30._12_4_;
    auVar32._12_4_ = auVar30._8_4_;
    auVar33._0_4_ = -(uint)((int)ptr_01 == 0);
    auVar33._4_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
    auVar33._8_4_ = -(uint)((int)ptr_02 == 0);
    auVar33._12_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0);
    auVar31._4_4_ = auVar33._0_4_;
    auVar31._0_4_ = auVar33._4_4_;
    auVar31._8_4_ = auVar33._12_4_;
    auVar31._12_4_ = auVar33._8_4_;
    auVar33 = packssdw(auVar32 & auVar30,auVar31 & auVar33);
    auVar26._0_4_ = -(uint)((int)ptr_03 == 0);
    auVar26._4_4_ = -(uint)((int)((ulong)ptr_03 >> 0x20) == 0);
    auVar26._8_4_ = -(uint)((int)ptr_04 == 0);
    auVar26._12_4_ = -(uint)((int)((ulong)ptr_04 >> 0x20) == 0);
    auVar28._4_4_ = auVar26._0_4_;
    auVar28._0_4_ = auVar26._4_4_;
    auVar28._8_4_ = auVar26._12_4_;
    auVar28._12_4_ = auVar26._8_4_;
    auVar29._0_4_ = -(uint)((int)ptr_05 == 0);
    auVar29._4_4_ = -(uint)((int)((ulong)ptr_05 >> 0x20) == 0);
    auVar29._8_4_ = -(uint)((int)ptr_06 == 0);
    auVar29._12_4_ = -(uint)((int)((ulong)ptr_06 >> 0x20) == 0);
    auVar27._4_4_ = auVar29._0_4_;
    auVar27._0_4_ = auVar29._4_4_;
    auVar27._8_4_ = auVar29._12_4_;
    auVar27._12_4_ = auVar29._8_4_;
    auVar29 = packssdw(auVar28 & auVar26,auVar27 & auVar29);
    auVar29 = packssdw(auVar33,auVar29);
    if ((ptr_08 != (int *)0x0 && ptr_07 != (int *)0x0) &&
        ((((((((auVar29 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar29 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar29 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar29 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar29[0xf]))
    {
      if (0 < _s1Len) {
        piVar6 = matrix->mapper;
        uVar12 = 0;
        do {
          ptr[uVar12] = piVar6[(byte)_s1[uVar12]];
          uVar12 = uVar12 + 1;
        } while ((uint)_s1Len != uVar12);
      }
      piVar6 = matrix->mapper;
      uVar12 = 0;
      do {
        ptr_00[uVar12] = piVar6[(byte)_s2[uVar12]];
        uVar12 = uVar12 + 1;
      } while ((uint)s2Len != uVar12);
      *ptr_01 = 0;
      *ptr_02 = 0;
      *ptr_03 = 0;
      *ptr_04 = 0;
      *ptr_05 = -0x40000000;
      *ptr_06 = 0;
      *ptr_07 = 0;
      *ptr_08 = 0;
      lVar13 = 0;
      do {
        ptr_01[lVar13 + 1] = 0;
        ptr_02[lVar13 + 1] = 0;
        ptr_03[lVar13 + 1] = 0;
        ptr_04[lVar13 + 1] = 0;
        ptr_05[lVar13 + 1] = -0x40000000;
        ptr_06[lVar13 + 1] = 0;
        ptr_07[lVar13 + 1] = 0;
        ptr_08[lVar13 + 1] = 0;
        lVar13 = lVar13 + 1;
      } while (size - 1 != lVar13);
      if (_s1Len < 1) {
        local_104 = -0x40000000;
        local_10c = -0x40000000;
        local_110 = -0x40000000;
        local_108 = -0x40000000;
        local_f8._0_4_ = s2Len;
      }
      else {
        uVar7 = _s1Len + 1;
        piVar6 = matrix->matrix;
        local_108 = -0x40000000;
        uVar12 = 1;
        local_110 = -0x40000000;
        local_10c = -0x40000000;
        local_104 = -0x40000000;
        do {
          if (matrix->type == 0) {
            lVar13 = (long)ptr[uVar12 - 1];
          }
          else {
            lVar13 = uVar12 - 1;
          }
          lVar13 = lVar13 * matrix->size;
          iVar23 = *ptr_01;
          iVar24 = *ptr_02;
          iVar16 = *ptr_03;
          iVar1 = *ptr_04;
          *ptr_01 = 0;
          *ptr_02 = 0;
          *ptr_03 = 0;
          local_d8 = 0;
          *ptr_04 = 0;
          iVar25 = -0x40000000;
          uVar19 = 1;
          local_dc = 0;
          local_e0 = 0;
          iVar18 = 0;
          iVar22 = 0;
          iVar17 = 0;
          iVar8 = 0;
          do {
            iVar2 = ptr_01[uVar19];
            iVar3 = ptr_02[uVar19];
            iVar4 = ptr_03[uVar19];
            iVar14 = iVar2 - open;
            iVar11 = ptr_05[uVar19] - gap;
            iVar15 = iVar11;
            if (iVar11 < iVar14) {
              iVar15 = iVar14;
            }
            iVar5 = ptr_04[uVar19];
            ptr_05[uVar19] = iVar15;
            iVar20 = iVar8 - open;
            iVar21 = iVar25 - gap;
            iVar25 = iVar20;
            if (iVar20 <= iVar21) {
              iVar25 = iVar21;
            }
            iVar23 = iVar23 + piVar6[lVar13 + ptr_00[uVar19 - 1]];
            iVar10 = iVar23;
            if (iVar23 <= iVar25) {
              iVar10 = iVar25;
            }
            if (iVar10 <= iVar15) {
              iVar10 = iVar15;
            }
            iVar8 = iVar10;
            if (iVar10 < 1) {
              iVar8 = 0;
            }
            if (iVar11 < iVar14) {
              ptr_06[uVar19] = iVar3;
              ptr_07[uVar19] = iVar4;
              iVar15 = iVar5;
            }
            else {
              iVar15 = ptr_08[uVar19];
            }
            ptr_08[uVar19] = iVar15 + 1;
            iVar11 = iVar22;
            iVar14 = iVar17;
            if (iVar20 <= iVar21) {
              iVar11 = local_dc;
              iVar18 = local_d8;
              iVar14 = local_e0;
            }
            local_d8 = iVar18 + 1;
            if (iVar8 == iVar23) {
              iVar22 = iVar16 + (uint)(0 < piVar6[lVar13 + ptr_00[uVar19 - 1]]);
              iVar18 = iVar1 + 1;
              iVar17 = iVar24 + (uint)(ptr[uVar12 - 1] == ptr_00[uVar19 - 1]);
            }
            else {
              iVar22 = iVar11;
              iVar18 = local_d8;
              iVar17 = iVar14;
              if (iVar8 == ptr_05[uVar19]) {
                iVar17 = ptr_06[uVar19];
                iVar22 = ptr_07[uVar19];
                iVar18 = iVar15 + 1;
              }
            }
            if (iVar10 < 1) {
              iVar8 = 0;
              iVar17 = 0;
              iVar22 = 0;
              iVar18 = 0;
            }
            ptr_01[uVar19] = iVar8;
            ptr_02[uVar19] = iVar17;
            ptr_03[uVar19] = iVar22;
            ptr_04[uVar19] = iVar18;
            iVar23 = iVar8;
            if ((local_104 < iVar8) ||
               ((iVar8 == local_104 && (iVar23 = local_104, (long)uVar19 <= (long)(int)local_f8))))
            {
              local_104 = iVar23;
              _s1Len = (int)uVar12 - 1;
              local_110 = iVar22;
              local_10c = iVar17;
              local_108 = iVar18;
              local_f8 = uVar19 - 1;
            }
            uVar19 = uVar19 + 1;
            iVar23 = iVar2;
            iVar24 = iVar3;
            iVar16 = iVar4;
            local_e0 = iVar14;
            local_dc = iVar11;
            iVar1 = iVar5;
          } while (size != uVar19);
          *(int *)(*(long *)((long)((ppVar9->field_4).trace)->trace_del_table + 0x20) + -4 +
                  uVar12 * 4) = iVar8;
          *(int *)(*(long *)((long)((ppVar9->field_4).trace)->trace_del_table + 0x28) + -4 +
                  uVar12 * 4) = iVar17;
          *(int *)(*(long *)((long)((ppVar9->field_4).trace)->trace_del_table + 0x30) + -4 +
                  uVar12 * 4) = iVar22;
          *(int *)(*(long *)((long)((ppVar9->field_4).trace)->trace_del_table + 0x38) + -4 +
                  uVar12 * 4) = iVar18;
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar7);
      }
      lVar13 = 0;
      do {
        *(int *)(*((ppVar9->field_4).trace)->trace_del_table + lVar13 * 4) = ptr_01[lVar13 + 1];
        *(int *)(*(long *)((long)((ppVar9->field_4).trace)->trace_del_table + 8) + lVar13 * 4) =
             ptr_02[lVar13 + 1];
        *(int *)(*(long *)((long)((ppVar9->field_4).trace)->trace_del_table + 0x10) + lVar13 * 4) =
             ptr_03[lVar13 + 1];
        *(int *)(*(long *)((long)((ppVar9->field_4).trace)->trace_del_table + 0x18) + lVar13 * 4) =
             ptr_04[lVar13 + 1];
        lVar13 = lVar13 + 1;
      } while (size - 1 != lVar13);
      ppVar9->score = local_104;
      ppVar9->end_query = _s1Len;
      ppVar9->end_ref = (int)local_f8;
      ((ppVar9->field_4).stats)->matches = local_10c;
      ((ppVar9->field_4).stats)->similar = local_110;
      ((ppVar9->field_4).stats)->length = local_108;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar9;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict HM = NULL;
    int * restrict HS = NULL;
    int * restrict HL = NULL;
    int * restrict F = NULL;
    int * restrict FM = NULL;
    int * restrict FS = NULL;
    int * restrict FL = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int matches = 0;
    int similar = 0;
    int length = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    matches = NEG_INF_32;
    similar = NEG_INF_32;
    length = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    H  = parasail_memalign_int(16, s2Len+1);
    HM = parasail_memalign_int(16, s2Len+1);
    HS = parasail_memalign_int(16, s2Len+1);
    HL = parasail_memalign_int(16, s2Len+1);
    F  = parasail_memalign_int(16, s2Len+1);
    FM = parasail_memalign_int(16, s2Len+1);
    FS = parasail_memalign_int(16, s2Len+1);
    FL = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!HM) return NULL;
    if (!HS) return NULL;
    if (!HL) return NULL;
    if (!F) return NULL;
    if (!FM) return NULL;
    if (!FS) return NULL;
    if (!FL) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    HM[0] = 0;
    HS[0] = 0;
    HL[0] = 0;
    F[0] = NEG_INF_32;
    FM[0] = 0;
    FS[0] = 0;
    FL[0] = 0;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = 0;
        HM[j] = 0;
        HS[j] = 0;
        HL[j] = 0;
        F[j] = NEG_INF_32;
        FM[j] = 0;
        FS[j] = 0;
        FL[j] = 0;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int NHM = HM[0];
        int NHS = HS[0];
        int NHL = HL[0];
        int WH = 0;
        int WHM = 0;
        int WHS = 0;
        int WHL = 0;
        int E = NEG_INF_32;
        int EM = 0;
        int ES = 0;
        int EL = 0;
        H[0] = WH;
        HM[0] = WHM;
        HS[0] = WHS;
        HL[0] = WHL;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            int NWM = NHM;
            int NWS = NHS;
            int NWL = NHL;
            NH = H[j];
            NHM = HM[j];
            NHS = HS[j];
            NHL = HL[j];
            F_opn = NH - open;
            F_ext  = F[j] - gap;
            F[j]  = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E - gap;
            E = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, 0);
            WH = MAX(WH, E);
            WH = MAX(WH, F[j]);
            if (F_opn > F_ext) {
                FM[j] = NHM;
                FS[j] = NHS;
                FL[j] = NHL;
            }
            FL[j] += 1;
            if (E_opn > E_ext) {
                EM = WHM;
                ES = WHS;
                EL = WHL;
            }
            EL += 1;
            if (WH == H_dag) {
                WHM  = NWM + (s1[i-1] == s2[j-1]);
                WHS  = NWS + (matrow[s2[j-1]] > 0);
                WHL  = NWL + 1;
            }
            else if (WH == F[j]) {
                WHM  = FM[j];
                WHS  = FS[j];
                WHL  = FL[j];
            }
            else {
                WHM  = EM;
                WHS  = ES;
                WHL  = EL;
            }
            if (WH <= 0) {
                WH = 0;
                WHM = 0;
                WHS = 0;
                WHL = 0;
            }
            H[j] = WH;
            HM[j] = WHM;
            HS[j] = WHS;
            HL[j] = WHL;
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
            result->stats->tables->matches_table[1LL*(i-1)*s2Len + (j-1)] = WHM;
            result->stats->tables->similar_table[1LL*(i-1)*s2Len + (j-1)] = WHS;
            result->stats->tables->length_table[1LL*(i-1)*s2Len + (j-1)] = WHL;
#endif
            if (WH > score) {
                score = WH;
                matches = WHM;
                similar = WHS;
                length = WHL;
                end_query = i-1;
                end_ref = j-1;
            }
            else if (score == WH && j-1 < end_ref) {
                matches = WHM;
                similar = WHS;
                length = WHL;
                end_query = i-1;
                end_ref = j-1;
            }
        }
#ifdef PARASAIL_ROWCOL
        result->stats->rowcols->score_col[i-1] = WH;
        result->stats->rowcols->matches_col[i-1] = WHM;
        result->stats->rowcols->similar_col[i-1] = WHS;
        result->stats->rowcols->length_col[i-1] = WHL;
#endif
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->stats->rowcols->score_row[j-1] = H[j];
        result->stats->rowcols->matches_row[j-1] = HM[j];
        result->stats->rowcols->similar_row[j-1] = HS[j];
        result->stats->rowcols->length_row[j-1] = HL[j];
    }
#endif

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(FL);
    parasail_free(FS);
    parasail_free(FM);
    parasail_free(F);
    parasail_free(HL);
    parasail_free(HS);
    parasail_free(HM);
    parasail_free(H);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}